

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConditionalBranchDirectiveSyntax::setChild
          (ConditionalBranchDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  TokenList *in_stack_ffffffffffffffa8;
  TokenList *in_stack_ffffffffffffffb0;
  ConditionalDirectiveExpressionSyntax *local_30;
  not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_ffffffffffffffa8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x2002c2);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (ConditionalDirectiveExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x2002d2);
      local_30 = SyntaxNode::as<slang::syntax::ConditionalDirectiveExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>::
    not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>(&local_28,&local_30);
    *(ConditionalDirectiveExpressionSyntax **)(in_RDI + 0x28) = local_28.ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x20031d);
    SyntaxNode::as<slang::syntax::TokenList>(pSVar1);
    TokenList::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void ConditionalBranchDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<ConditionalDirectiveExpressionSyntax>() : nullptr; return;
        case 2: disabledTokens = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}